

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::LegalizeOpnds<false>
               (Instr *instr,LegalForms dstForms,LegalForms src1Forms,LegalForms src2Forms)

{
  code *pcVar1;
  Instr *pIVar2;
  bool bVar3;
  LegalForms LVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  bool local_31;
  anon_class_1_0_00000001 local_14;
  LegalForms local_13;
  LegalForms local_12;
  LegalForms local_11;
  bool hasMemOpnd;
  anon_class_1_0_00000001 NormalizeForms;
  LegalForms src2Forms_local;
  LegalForms src1Forms_local;
  Instr *pIStack_10;
  LegalForms dstForms_local;
  Instr *instr_local;
  
  local_13 = src2Forms;
  local_12 = src1Forms;
  local_11 = dstForms;
  pIStack_10 = instr;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x769,"(instr)","instr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  LVar4 = ::operator&(local_11,LF_Optional);
  if (LVar4 == L_None) {
    pOVar6 = IR::Instr::GetDst(pIStack_10);
    bVar3 = operator!(local_11);
    if ((pOVar6 == (Opnd *)0x0) != bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x76a,"(dstForms & LF_Optional || !instr->GetDst() == !dstForms)",
                         "dstForms & LF_Optional || !instr->GetDst() == !dstForms");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  LVar4 = ::operator&(local_12,LF_Optional);
  if (LVar4 == L_None) {
    pOVar6 = IR::Instr::GetSrc1(pIStack_10);
    bVar3 = operator!(local_12);
    if ((pOVar6 == (Opnd *)0x0) != bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x76b,"(src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms)",
                         "src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  LVar4 = ::operator&(local_13,LF_Optional);
  if (LVar4 == L_None) {
    pOVar6 = IR::Instr::GetSrc2(pIStack_10);
    bVar3 = operator!(local_13);
    if ((pOVar6 == (Opnd *)0x0) != bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x76c,"(src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms)",
                         "src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if ((local_12 == L_None) && (bVar3 = operator!(local_13), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76d,"(src1Forms || !src2Forms)","src1Forms || !src2Forms");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((local_11 != L_None) &&
     (pOVar6 = IR::Instr::GetDst(pIStack_10), pIVar2 = pIStack_10, pOVar6 != (Opnd *)0x0)) {
    LVar4 = LegalizeOpnds<false>::anon_class_1_0_00000001::operator()(&local_14,local_11);
    LegalizeDst<false>(pIVar2,LVar4);
  }
  bVar3 = operator!(local_12);
  if ((!bVar3) && (pOVar6 = IR::Instr::GetSrc1(pIStack_10), pOVar6 != (Opnd *)0x0)) {
    pOVar6 = IR::Instr::GetDst(pIStack_10);
    local_31 = false;
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetDst(pIStack_10);
      local_31 = IR::Opnd::IsMemoryOpnd(pOVar6);
    }
    if (((local_31 != false) && (LVar4 = ::operator&(local_12,L_Mem), LVar4 != L_None)) &&
       (bVar3 = EncoderMD::IsOPEQ(pIStack_10), !bVar3)) {
      operator^=(&local_12,L_Mem);
    }
    pIVar2 = pIStack_10;
    pOVar6 = IR::Instr::GetSrc1(pIStack_10);
    LVar4 = LegalizeOpnds<false>::anon_class_1_0_00000001::operator()(&local_14,local_12);
    LegalizeSrc<false>(pIVar2,pOVar6,LVar4);
    pOVar6 = IR::Instr::GetSrc1(pIStack_10);
    bVar3 = IR::Opnd::IsMemoryOpnd(pOVar6);
    if ((local_31 != false || bVar3) && (LVar4 = ::operator&(local_13,L_Mem), LVar4 != L_None)) {
      operator^=(&local_13,L_Mem);
    }
    if ((local_13 != L_None) &&
       (pOVar6 = IR::Instr::GetSrc2(pIStack_10), pIVar2 = pIStack_10, pOVar6 != (Opnd *)0x0)) {
      pOVar6 = IR::Instr::GetSrc2(pIStack_10);
      LVar4 = LegalizeOpnds<false>::anon_class_1_0_00000001::operator()(&local_14,local_13);
      LegalizeSrc<false>(pIVar2,pOVar6,LVar4);
    }
  }
  return;
}

Assistant:

void LowererMD::LegalizeOpnds(IR::Instr *const instr, const LegalForms dstForms, LegalForms src1Forms, LegalForms src2Forms)
{
    Assert(instr);
    Assert(dstForms & LF_Optional || !instr->GetDst() == !dstForms);
    Assert(src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms);
    Assert(src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms);
    Assert(src1Forms || !src2Forms);

    const auto NormalizeForms = [](LegalForms forms) -> LegalForms
    {
    #ifdef _M_X64
        if(forms & L_Ptr)
        {
            forms |= L_Imm32;
        }
    #else
        if(forms & (L_Imm32 | L_Ptr))
        {
            forms |= L_Imm32 | L_Ptr;
        }
    #endif
        // Remove Legal Flags
        forms &= L_FormMask;
        return forms;
    };

    if(dstForms && instr->GetDst())
    {
        LegalizeDst<verify>(instr, NormalizeForms(dstForms));
    }
    if(!src1Forms || !instr->GetSrc1())
    {
        return;
    }
    bool hasMemOpnd = instr->GetDst() && instr->GetDst()->IsMemoryOpnd();

    // Allow src1 to be a mem opnd if dst & src1 must be the same
    if (hasMemOpnd && src1Forms & L_Mem && !EncoderMD::IsOPEQ(instr))
    {
        src1Forms ^= L_Mem;
    }
    LegalizeSrc<verify>(instr, instr->GetSrc1(), NormalizeForms(src1Forms));

    hasMemOpnd |= instr->GetSrc1()->IsMemoryOpnd();
    // If dst or src1 is a mem opnd, mem2 cannot be a mem opnd
    if(hasMemOpnd && src2Forms & L_Mem)
    {
        src2Forms ^= L_Mem;
    }
    if(src2Forms && instr->GetSrc2())
    {
        LegalizeSrc<verify>(instr, instr->GetSrc2(), NormalizeForms(src2Forms));
    }
}